

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O0

any __thiscall
cs_impl::
cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::any_&)>
::_call<0>(cni_helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::any_&),_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(*)(const_cs_impl::any_&)>
           *this,vector *args,sequence<0> *param_3)

{
  reference val;
  string *psVar1;
  vector<cs_impl::any,_std::allocator<cs_impl::any>_> *in_RDX;
  proxy *in_RDI;
  any in_stack_ffffffffffffffc0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cs_impl::any_&)>
  *in_stack_ffffffffffffffc8;
  
  val = std::vector<cs_impl::any,_std::allocator<cs_impl::any>_>::operator[](in_RDX,0);
  try_convert_and_check<const_cs_impl::any_&,_const_cs_impl::any_&,_cs_impl::any,_0UL>::convert(val)
  ;
  std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_cs_impl::any_&)>
  ::operator()(in_stack_ffffffffffffffc8,(any *)in_stack_ffffffffffffffc0.mDat);
  psVar1 = (string *)
           type_convertor<std::__cxx11::string,std::__cxx11::string>::convert<std::__cxx11::string>
                     ((any *)&stack0xffffffffffffffc0);
  std::__cxx11::string::string((string *)in_RDI,psVar1);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return (any)in_RDI;
}

Assistant:

_Source_RetT _call(cs::vector &args, const cov::sequence<S...> &) const
		{
			return type_convertor<_Target_RetT, _Source_RetT>::convert(
			           mFunc(try_convert<_Target_ArgsT, _Source_ArgsT, S>::convert(args[S])...));
		}